

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::suppressContractions
          (CollationDataBuilder *this,UnicodeSet *set,UErrorCode *errorCode)

{
  CollationData *this_00;
  UBool UVar1;
  uint c_00;
  uint32_t uVar2;
  ConditionalCE32 *pCVar3;
  bool bVar4;
  uint32_t ce32;
  UChar32 c;
  undefined1 local_60 [8];
  UnicodeSetIterator iter;
  UErrorCode *errorCode_local;
  UnicodeSet *set_local;
  CollationDataBuilder *this_local;
  
  iter.cpString = (UnicodeString *)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (UVar1 = UnicodeSet::isEmpty(set), UVar1 == '\0')) {
    UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_60,set);
    while( true ) {
      UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_60);
      bVar4 = false;
      if (UVar1 != '\0') {
        UVar1 = UnicodeSetIterator::isString((UnicodeSetIterator *)local_60);
        bVar4 = UVar1 == '\0';
      }
      if (!bVar4) break;
      c_00 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_60);
      uVar2 = utrie2_get32_63(this->trie,c_00);
      if (uVar2 == 0xc0) {
        this_00 = this->base;
        uVar2 = CollationData::getCE32(this_00,c_00);
        uVar2 = CollationData::getFinalCE32(this_00,uVar2);
        UVar1 = Collation::ce32HasContext(uVar2);
        if (UVar1 != '\0') {
          uVar2 = copyFromBaseCE32(this,c_00,uVar2,'\0',(UErrorCode *)iter.cpString);
          utrie2_set32_63(this->trie,c_00,uVar2,(UErrorCode *)iter.cpString);
        }
      }
      else {
        UVar1 = isBuilderContextCE32(uVar2);
        if (UVar1 != '\0') {
          pCVar3 = getConditionalCE32ForCE32(this,uVar2);
          utrie2_set32_63(this->trie,c_00,pCVar3->ce32,(UErrorCode *)iter.cpString);
          UnicodeSet::remove(&this->contextChars,(char *)(ulong)c_00);
        }
      }
    }
    this->modified = '\x01';
    UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_60);
  }
  return;
}

Assistant:

void
CollationDataBuilder::suppressContractions(const UnicodeSet &set, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || set.isEmpty()) { return; }
    UnicodeSetIterator iter(set);
    while(iter.next() && !iter.isString()) {
        UChar32 c = iter.getCodepoint();
        uint32_t ce32 = utrie2_get32(trie, c);
        if(ce32 == Collation::FALLBACK_CE32) {
            ce32 = base->getFinalCE32(base->getCE32(c));
            if(Collation::ce32HasContext(ce32)) {
                ce32 = copyFromBaseCE32(c, ce32, FALSE /* without context */, errorCode);
                utrie2_set32(trie, c, ce32, &errorCode);
            }
        } else if(isBuilderContextCE32(ce32)) {
            ce32 = getConditionalCE32ForCE32(ce32)->ce32;
            // Simply abandon the list of ConditionalCE32.
            // The caller will copy this builder in the end,
            // eliminating unreachable data.
            utrie2_set32(trie, c, ce32, &errorCode);
            contextChars.remove(c);
        }
    }
    modified = TRUE;
}